

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_cursor.hpp
# Opt level: O1

bool __thiscall
jsoncons::basic_staj_visitor<char>::visit_typed_array
          (basic_staj_visitor<char> *this,span<const_unsigned_int,_18446744073709551615UL> *data,
          semantic_tag tag,ser_context *context,error_code *ec)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_type sVar3;
  undefined7 in_register_00000011;
  
  this->state_ = typed_array;
  uVar1 = *(undefined4 *)((long)&data->data_ + 4);
  sVar3 = data->size_;
  uVar2 = *(undefined4 *)((long)&data->size_ + 4);
  *(undefined4 *)&(this->data_).data_ = *(undefined4 *)&data->data_;
  *(undefined4 *)((long)&(this->data_).data_ + 4) = uVar1;
  *(int *)&(this->data_).size_ = (int)sVar3;
  *(undefined4 *)((long)&(this->data_).size_ + 4) = uVar2;
  (this->data_).type_ = uint32_value;
  this->index_ = 0;
  (*(this->super_basic_json_visitor<char>)._vptr_basic_json_visitor[6])
            (this,CONCAT71(in_register_00000011,tag) & 0xffffffff,context,ec);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const uint32_t>& data, 
        semantic_tag tag,
        const ser_context& context,
        std::error_code& ec) override
    {
        state_ = staj_cursor_state::typed_array;
        data_ = typed_array_view(data.data(), data.size());
        index_ = 0;
        this->begin_array(tag, context, ec);
        JSONCONS_VISITOR_RETURN;
    }